

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

DdNode * Cudd_SubsetWithMaskVars
                   (DdManager *dd,DdNode *f,DdNode **vars,int nvars,DdNode **maskVars,int mvars)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  int iVar7;
  DdNode *pDVar8;
  void *__s;
  void *__s_00;
  void *__s_01;
  void *__ptr;
  DdNode *pDVar9;
  ulong uVar10;
  DdNode *pDVar11;
  DdNode *pDVar12;
  DdNode *pDVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  double dVar17;
  double dVar18;
  
  pDVar8 = Cudd_Support(dd,f);
  piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  Cudd_RecursiveDeref(dd,pDVar8);
  uVar3 = dd->size;
  lVar15 = (long)(int)uVar3;
  __s = malloc(lVar15 * 8);
  if (__s == (void *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  else {
    if (0 < (int)uVar3) {
      memset(__s,0,(ulong)uVar3 * 8);
    }
    if (0 < mvars) {
      uVar16 = 0;
      do {
        pDVar8 = Cudd_Cofactor(dd,f,maskVars[uVar16]);
        piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        dVar17 = Cudd_CountMinterm(dd,pDVar8,nvars);
        *(double *)((long)__s + uVar16 * 8) = dVar17;
        Cudd_RecursiveDeref(dd,pDVar8);
        pDVar8 = Cudd_Cofactor(dd,f,(DdNode *)((ulong)maskVars[uVar16] ^ 1));
        piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        dVar18 = Cudd_CountMinterm(dd,pDVar8,nvars);
        *(double *)((long)__s + uVar16 * 8) = dVar17 - dVar18;
        Cudd_RecursiveDeref(dd,pDVar8);
        uVar16 = uVar16 + 1;
      } while ((uint)mvars != uVar16);
    }
    __s_00 = malloc(lVar15 + 1);
    if (__s_00 == (void *)0x0) {
      dd->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      __s_01 = malloc(lVar15 * 4);
      if (__s_01 == (void *)0x0) {
        dd->errorCode = CUDD_MEMORY_OUT;
        free(__s);
        __s = __s_00;
      }
      else {
        if (0 < (int)uVar3) {
          memset(__s_00,0x32,(ulong)uVar3);
          memset(__s_01,0,lVar15 * 4);
        }
        *(undefined1 *)((long)__s_00 + lVar15) = 0;
        __ptr = malloc((long)nvars << 2);
        if (__ptr == (void *)0x0) {
          dd->errorCode = CUDD_MEMORY_OUT;
          free(__s);
          free(__s_00);
          __s = __s_01;
        }
        else {
          uVar16 = (ulong)(uint)nvars;
          if (0 < nvars) {
            uVar10 = 0;
            do {
              *(DdHalfWord *)((long)__ptr + uVar10 * 4) = vars[uVar10]->index;
              uVar10 = uVar10 + 1;
            } while (uVar16 != uVar10);
          }
          if (f != (DdNode *)0x0) {
            pDVar8 = dd->one;
            pDVar9 = (DdNode *)((ulong)pDVar8 ^ 1);
            if (pDVar9 != f) {
              pDVar11 = (DdNode *)((ulong)f & 0xfffffffffffffffe);
              pDVar12 = f;
              if (pDVar8 != pDVar11 && pDVar8 != f) {
                do {
                  pDVar4 = (pDVar11->type).kids.T;
                  pDVar5 = (pDVar11->type).kids.E;
                  pDVar13 = (DdNode *)((ulong)pDVar5 ^ 1);
                  pDVar6 = (DdNode *)((ulong)pDVar4 ^ 1);
                  if (((ulong)pDVar12 & 1) == 0) {
                    pDVar13 = pDVar5;
                    pDVar6 = pDVar4;
                  }
                  if (0.0 <= *(double *)((long)__s + (ulong)pDVar11->index * 8)) {
                    pDVar12 = pDVar13;
                    if (pDVar6 != pDVar9) {
                      pDVar12 = pDVar6;
                    }
                    bVar14 = pDVar6 == pDVar9 ^ 0x31;
                  }
                  else {
                    pDVar12 = pDVar6;
                    if (pDVar13 != pDVar9) {
                      pDVar12 = pDVar13;
                    }
                    bVar14 = pDVar13 == pDVar9 | 0x30;
                  }
                  *(byte *)((long)__s_00 + (ulong)pDVar11->index) = bVar14;
                  pDVar11 = (DdNode *)((ulong)pDVar12 & 0xfffffffffffffffe);
                } while (pDVar8 != pDVar11);
              }
              pDVar8 = Cudd_ReadOne(dd);
              piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar9 = Cudd_ReadOne(dd);
              if (0 < nvars) {
                uVar10 = 0;
                pDVar12 = pDVar8;
                do {
                  cVar2 = *(char *)((long)__s_00 + (long)*(int *)((long)__ptr + uVar10 * 4));
                  if (cVar2 == '1') {
                    pDVar8 = vars[uVar10];
LAB_0079c363:
                    pDVar8 = Cudd_bddIte(dd,pDVar12,pDVar8,(DdNode *)((ulong)pDVar9 ^ 1));
                    if (pDVar8 == (DdNode *)0x0) {
                      free(__s);
                      free(__s_00);
                      free(__s_01);
                      free(__ptr);
                      goto LAB_0079c65f;
                    }
                    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                    Cudd_RecursiveDeref(dd,pDVar12);
                  }
                  else {
                    pDVar8 = pDVar12;
                    if (cVar2 == '0') {
                      pDVar8 = (DdNode *)((ulong)vars[uVar10] ^ 1);
                      goto LAB_0079c363;
                    }
                  }
                  uVar10 = uVar10 + 1;
                  pDVar12 = pDVar8;
                } while (uVar16 != uVar10);
              }
              Cudd_RecursiveDeref(dd,pDVar8);
              if (0 < mvars) {
                uVar10 = 0;
                do {
                  *(undefined4 *)((long)__s_01 + (ulong)maskVars[uVar10]->index * 4) = 1;
                  uVar10 = uVar10 + 1;
                } while ((uint)mvars != uVar10);
              }
              if (0 < nvars) {
                uVar10 = 0;
                do {
                  lVar15 = (long)*(int *)((long)__ptr + uVar10 * 4);
                  if (*(int *)((long)__s_01 + lVar15 * 4) == 0) {
                    bVar14 = 0x32;
LAB_0079c4c0:
                    *(byte *)((long)__s_00 + lVar15) = bVar14;
                  }
                  else if (*(char *)((long)__s_00 + lVar15) == '2') {
                    bVar14 = *(double *)((long)__s + lVar15 * 8) < 0.0 ^ 0x31;
                    goto LAB_0079c4c0;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar16 != uVar10);
              }
              pDVar8 = Cudd_ReadOne(dd);
              piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              pDVar9 = Cudd_ReadOne(dd);
              if (0 < nvars) {
                uVar10 = 0;
                pDVar12 = pDVar8;
                do {
                  cVar2 = *(char *)((long)__s_00 + (long)*(int *)((long)__ptr + uVar10 * 4));
                  if (cVar2 == '1') {
                    pDVar8 = vars[uVar10];
LAB_0079c530:
                    pDVar8 = Cudd_bddIte(dd,pDVar12,pDVar8,(DdNode *)((ulong)pDVar9 ^ 1));
                    if (pDVar8 == (DdNode *)0x0) {
                      free(__s);
                      free(__s_00);
                      free(__s_01);
                      free(__ptr);
LAB_0079c65f:
                      Cudd_RecursiveDeref(dd,pDVar12);
                      return (DdNode *)0x0;
                    }
                    piVar1 = (int *)(((ulong)pDVar8 & 0xfffffffffffffffe) + 4);
                    *piVar1 = *piVar1 + 1;
                    Cudd_RecursiveDeref(dd,pDVar12);
                  }
                  else {
                    pDVar8 = pDVar12;
                    if (cVar2 == '0') {
                      pDVar8 = (DdNode *)((ulong)vars[uVar10] ^ 1);
                      goto LAB_0079c530;
                    }
                  }
                  uVar10 = uVar10 + 1;
                  pDVar12 = pDVar8;
                } while (uVar16 != uVar10);
              }
              pDVar9 = Cudd_bddAnd(dd,f,pDVar8);
              piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
              *piVar1 = *piVar1 + 1;
              Cudd_RecursiveDeref(dd,pDVar8);
              iVar7 = Cudd_bddLeq(dd,pDVar9,f);
              if (iVar7 == 0) {
                Cudd_RecursiveDeref(dd,pDVar9);
                pDVar9 = (DdNode *)0x0;
              }
              else {
                piVar1 = (int *)(((ulong)pDVar9 & 0xfffffffffffffffe) + 4);
                *piVar1 = *piVar1 + -1;
              }
              free(__s);
              free(__s_00);
              free(__s_01);
              free(__ptr);
              return pDVar9;
            }
          }
          free(__s);
          free(__s_00);
          free(__s_01);
          __s = __ptr;
        }
      }
    }
    free(__s);
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode *
Cudd_SubsetWithMaskVars(
  DdManager * dd /* manager */,
  DdNode * f /* function from which to pick a cube */,
  DdNode ** vars /* array of variables */,
  int  nvars /* size of <code>vars</code> */,
  DdNode ** maskVars /* array of variables */,
  int  mvars /* size of <code>maskVars</code> */)
{
    double      *weight;
    char        *string;
    int         i, size;
    int         *indices, *mask;
    int         result;
    DdNode      *zero, *cube, *newCube, *subset;
    DdNode      *cof;

    DdNode      *support;
    support = Cudd_Support(dd,f);
    cuddRef(support);
    Cudd_RecursiveDeref(dd,support);

    zero = Cudd_Not(dd->one);
    size = dd->size;

    weight = ABC_ALLOC(double,size);
    if (weight == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        weight[i] = 0.0;
    }
    for (i = 0; i < mvars; i++) {
        cof = Cudd_Cofactor(dd, f, maskVars[i]);
        cuddRef(cof);
        weight[i] = Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);

        cof = Cudd_Cofactor(dd, f, Cudd_Not(maskVars[i]));
        cuddRef(cof);
        weight[i] -= Cudd_CountMinterm(dd, cof, nvars);
        Cudd_RecursiveDeref(dd,cof);
    }

    string = ABC_ALLOC(char, size + 1);
    if (string == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        return(NULL);
    }
    mask = ABC_ALLOC(int, size);
    if (mask == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        return(NULL);
    }
    for (i = 0; i < size; i++) {
        string[i] = '2';
        mask[i] = 0;
    }
    string[size] = '\0';
    indices = ABC_ALLOC(int,nvars);
    if (indices == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        return(NULL);
    }
    for (i = 0; i < nvars; i++) {
        indices[i] = vars[i]->index;
    }

    result = ddPickRepresentativeCube(dd,f,weight,string);
    if (result == 0) {
        ABC_FREE(weight);
        ABC_FREE(string);
        ABC_FREE(mask);
        ABC_FREE(indices);
        return(NULL);
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }
    Cudd_RecursiveDeref(dd,cube);

    for (i = 0; i < mvars; i++) {
        mask[maskVars[i]->index] = 1;
    }
    for (i = 0; i < nvars; i++) {
        if (mask[indices[i]]) {
            if (string[indices[i]] == '2') {
                if (weight[indices[i]] >= 0.0)
                    string[indices[i]] = '1';
                else
                    string[indices[i]] = '0';
            }
        } else {
            string[indices[i]] = '2';
        }
    }

    cube = Cudd_ReadOne(dd);
    cuddRef(cube);
    zero = Cudd_Not(Cudd_ReadOne(dd));

    /* Build result BDD. */
    for (i = 0; i < nvars; i++) {
        if (string[indices[i]] == '0') {
            newCube = Cudd_bddIte(dd,cube,Cudd_Not(vars[i]),zero);
        } else if (string[indices[i]] == '1') {
            newCube = Cudd_bddIte(dd,cube,vars[i],zero);
        } else
            continue;
        if (newCube == NULL) {
            ABC_FREE(weight);
            ABC_FREE(string);
            ABC_FREE(mask);
            ABC_FREE(indices);
            Cudd_RecursiveDeref(dd,cube);
            return(NULL);
        }
        cuddRef(newCube);
        Cudd_RecursiveDeref(dd,cube);
        cube = newCube;
    }

    subset = Cudd_bddAnd(dd,f,cube);
    cuddRef(subset);
    Cudd_RecursiveDeref(dd,cube);

    /* Test. */
    if (Cudd_bddLeq(dd,subset,f)) {
        cuddDeref(subset);
    } else {
        Cudd_RecursiveDeref(dd,subset);
        subset = NULL;
    }

    ABC_FREE(weight);
    ABC_FREE(string);
    ABC_FREE(mask);
    ABC_FREE(indices);
    return(subset);

}